

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

uint32 rw::ps2::getSizeNativeTexture(Texture *tex)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = strlen(tex->name);
  sVar2 = strlen(tex->mask);
  return *(int *)(&tex->raster->field_0x24 + nativeRasterOffset) +
         ((int)sVar1 + 0x24U & 0xfffffffc) + ((uint)sVar2 & 0xfffffffc) +
         *(int *)((long)&tex->raster->stride + (long)nativeRasterOffset) + 0x74;
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 8;
	size += 12 + strlen(tex->name)+4 & ~3;
	size += 12 + strlen(tex->mask)+4 & ~3;
	size += 12;
	size += 12 + 64;
	Ps2Raster *ras = GETPS2RASTEREXT(tex->raster);
	size += 12 + ras->pixelSize + ras->paletteSize;
	return size;
}